

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double tinv(double p,int df)

{
  double dVar1;
  double sign;
  double d2;
  double y;
  double x;
  double pmin;
  double q;
  double t;
  int df_local;
  double p_local;
  
  if (df < 1) {
    printf("Degree Of Freedom should be a positive real integer");
    exit(1);
  }
  if ((0.0 <= p) && (p <= 1.0)) {
    if (1.0 - p < p) {
      x = (1.0 - p) * 2.0;
    }
    else {
      x = p * 2.0;
    }
    if ((p == 0.0) && (!NAN(p))) {
      q = -1.79e+308;
    }
    if ((p == 1.0) && (!NAN(p))) {
      q = 1.79e+308;
    }
    if (((0.0 < p) && (p < 1.0)) && (df < 0x3e9)) {
      dVar1 = betainv(x,(double)df / 2.0,0.5);
      q = sqrt(((double)df * (1.0 - dVar1)) / dVar1);
    }
    if (((0.0 < p) && (p < 1.0)) && (1000 < df)) {
      q = tinv_appx(p,df);
    }
    return q;
  }
  printf("Probablity Values can only take values between 0.0 and 1.0");
  exit(1);
}

Assistant:

double tinv(double p, int df) {
	double t,q,pmin,x,y,d2,sign;
	
	if (df <= 0) {
		printf("Degree Of Freedom should be a positive real integer");
		exit(1);
	}
	
	if (p < 0. || p > 1.0) {
		printf("Probablity Values can only take values between 0.0 and 1.0");
		exit(1);
	}
	
	q = 1. - p;
	
	if ( p <= q ) {
		pmin = 2.0 * p;
	} else {
		pmin = 2.0 * q;
	}
	
	// XINFVAL value is set to 1.79e+308. It can be changed in erfunc.h file.
	
	if ( p == 0.) {
		t = -XINFVAL;
	}
	
	if ( p == 1.) {
		t = XINFVAL;
	}
	
	
	if ( p > 0. && p < 1. && df <= 1000 ) {
		if (p < 0.5) {
			sign = - 1.0;
		} else {
			sign = 1.0;
		}
		
		d2 = ((double) df ) / 2.0;
		x = betainv(pmin,d2,0.5);
		y = 1. - x;
		
		t = sqrt( (double) df * y / x);
	}
	
	if ( p > 0. && p < 1. && df > 1000 ) {
		t = tinv_appx(p,df);
	}
	
	return t;
}